

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm_proto.c
# Opt level: O3

pkt_status_t send_mm_packet(mm_proto_t *proto,uint8_t *payload,size_t len,uint8_t flags)

{
  uint8_t type;
  byte bVar1;
  int i;
  pkt_status_t pVar2;
  long lVar3;
  char *pcVar4;
  ulong uVar5;
  char *pcVar6;
  byte bVar7;
  pkt_status_t pVar8;
  char *__format;
  uint uVar9;
  ulong uVar10;
  timespec tim;
  timespec local_148;
  mm_packet_t local_136;
  
  pcVar6 = "ACK";
  if ((flags & 8) == 0) {
    pcVar6 = "NACK";
  }
  bVar1 = (char)len + 5;
  uVar10 = 0;
  while( true ) {
    if (proto->connected == 0) {
      return 2;
    }
    if (3 < proto->debuglevel) {
      if (payload == (uint8_t *)0x0) {
        bVar7 = proto->rx_seq;
        __format = "T<--M Sending %s: rx_seq=%d\n";
        pcVar4 = pcVar6;
      }
      else {
        bVar7 = proto->tx_seq;
        __format = "T<--M Sending packet: Terminal: %s, tx_seq=%d\n";
        pcVar4 = proto->terminal_id;
      }
      printf(__format,pcVar4,(ulong)bVar7);
    }
    if (proto->use_modem != '\0') {
      local_148.tv_sec = 0;
      local_148.tv_nsec = (ulong)proto->rx_packet_gap * 10000000;
      nanosleep(&local_148,(timespec *)0x0);
    }
    memset(&local_136.hdr.flags,0,0x105);
    local_136.hdr.start = '\x02';
    if (payload == (uint8_t *)0x0) {
      bVar7 = proto->rx_seq & 3 | flags;
      local_136.hdr.flags = bVar7;
    }
    else {
      bVar7 = proto->tx_seq & 3;
      lVar3 = 0;
      do {
        local_136.payload[lVar3] =
             proto->terminal_id[lVar3 * 2 + 1] - 0x30U | proto->terminal_id[lVar3 * 2] << 4;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 5);
      local_136.hdr.flags = bVar7;
      local_136.payload_len = bVar1;
      if (len != 0) {
        memcpy(local_136.payload + 5,payload,len);
      }
    }
    if ((flags & 4) != 0) {
      local_136.hdr.flags = bVar7 | 4;
    }
    local_136.hdr.pktlen = local_136.payload_len + 5;
    local_136.trailer.crc = crc16(0,(uint8_t *)&local_136,3);
    local_136.trailer.crc =
         crc16(local_136.trailer.crc,local_136.payload,(ulong)local_136.payload_len);
    if ((inject_comm_error == 1) &&
       ((type = proto->error_inject_type, type == '\x01' && local_136.payload_len != 0 ||
        (type == '\x02' && local_136.payload_len == 0)))) {
      pcVar4 = error_inject_type_to_str(type);
      printf("Injecting %s (Correct CRC=0x%02x).\n",pcVar4,(ulong)local_136.trailer.crc);
      inject_comm_error = 0;
      local_136.trailer.crc = ~local_136.trailer.crc;
    }
    local_136.trailer.end = '\x03';
    uVar5 = (ulong)local_136.payload_len;
    local_136.calculated_crc = local_136.trailer.crc;
    local_136.payload[uVar5 + 2] = '\x03';
    *(uint16_t *)(local_136.payload + uVar5) = local_136.trailer.crc;
    mm_add_pcap_rec(proto->pcapstream,3,&local_136,0,0);
    if (proto->send_udp != '\0') {
      mm_udp_send_pkt(3,&local_136);
    }
    if ((proto->debuglevel != '\0') && (print_mm_packet(3,&local_136), 3 < proto->debuglevel)) {
      printf("\nRaw Packet transmitted: ");
      dump_hex((uint8_t *)&local_136,(ulong)local_136.hdr.pktlen + 1);
    }
    write_serial(proto->serial_context,&local_136,(ulong)local_136.hdr.pktlen + 1);
    drain_serial(proto->serial_context);
    if (payload == (uint8_t *)0x0) {
      proto->rx_seq = proto->rx_seq + '\x01';
      return 0;
    }
    pVar2 = wait_for_mm_ack(proto);
    if (pVar2 == 0) break;
    printf("%s: Received NACK, retrying %d.\n","send_mm_packet",uVar10);
    uVar9 = (int)uVar10 + 1;
    uVar10 = (ulong)uVar9;
    if (uVar9 == 5) {
LAB_001123c0:
      printf("%s: Error: Gave up after %d retries.\n","send_mm_packet",5);
      pVar8 = pVar2 | 0x200;
LAB_001123e2:
      proto->tx_seq = proto->tx_seq + '\x01';
      return pVar8;
    }
  }
  pVar8 = 0;
  if ((int)uVar10 != 5) goto LAB_001123e2;
  goto LAB_001123c0;
}

Assistant:

static pkt_status_t send_mm_packet(mm_proto_t* proto, uint8_t* payload, size_t len, uint8_t flags) {
    mm_packet_t pkt;
    pkt_status_t status = PKT_SUCCESS;
    int retries;

    for (retries = 0; retries < PKT_MAX_RETRIES; retries++) {
        /* Bail out if not connected. */
        if (!proto->connected) {
            return PKT_ERROR_DISCONNECT;
        }

        if (proto->debuglevel > 3) {
            if (payload != NULL) {
                printf("T<--M Sending packet: Terminal: %s, tx_seq=%d\n", proto->terminal_id, proto->tx_seq);
            }
            else {
                printf("T<--M Sending %s: rx_seq=%d\n", (flags & FLAG_ACK) ? "ACK" : "NACK", proto->rx_seq);
            }
        }

        /* Insert Tx packet delay when using a modem, in 10ms increments. */
        if (proto->use_modem) {
#ifdef _WIN32
            Sleep(proto->rx_packet_gap * 10);
#else  /* ifdef _WIN32 */
            struct timespec tim;
            tim.tv_sec = 0;
            tim.tv_nsec = proto->rx_packet_gap * 10000000L;
            nanosleep(&tim, NULL);
#endif /* _WIN32 */
        }

        memset(&pkt, 0, sizeof(pkt));
        pkt.hdr.start = START_BYTE;

        if (payload != NULL) {
            /* Flags for regular TX packet use tx_seq. */
            pkt.hdr.flags = (proto->tx_seq & FLAG_SEQUENCE);
            pkt.payload_len = (uint8_t)len + PKT_TABLE_ID_OFFSET; /* add room for the phone number. */

            for (int i = 0; i < PKT_TABLE_ID_OFFSET; i++) {
                pkt.payload[i] = (proto->terminal_id[i * 2] - '0') << 4;
                pkt.payload[i] |= (proto->terminal_id[i * 2 + 1] - '0');
            }

            if (len > 0) {
                memcpy(&pkt.payload[PKT_TABLE_ID_OFFSET], payload, len);
            }
        } else {
            pkt.payload_len = 0;

            /* If payload is NULL, send an ACK packet instead, using rx_seq. */
            pkt.hdr.flags = flags | (proto->rx_seq & FLAG_SEQUENCE);
        }

        if (flags & FLAG_RETRY) {
            pkt.hdr.flags |= FLAG_RETRY;
        }

        pkt.hdr.pktlen = pkt.payload_len + 5;
        pkt.trailer.crc = crc16(0, &pkt.hdr.start, 3);
        pkt.trailer.crc = crc16(pkt.trailer.crc, pkt.payload, (size_t)(pkt.payload_len));
        pkt.trailer.crc = LE16(pkt.trailer.crc);
        if (inject_comm_error == 1) {
            if (((proto->error_inject_type == ERROR_INJECT_CRC_DLOG_TX) && (pkt.payload_len != 0)) ||
                ((proto->error_inject_type == ERROR_INJECT_CRC_ACK_TX) && (pkt.payload_len == 0))) {
                printf("Injecting %s (Correct CRC=0x%02x).\n",
                    error_inject_type_to_str(proto->error_inject_type),
                    pkt.trailer.crc);
                inject_comm_error = 0;
                pkt.trailer.crc = ~pkt.trailer.crc;
            }
        }
        pkt.trailer.end = STOP_BYTE;
        pkt.calculated_crc = pkt.trailer.crc;

        /* Copy the CRC and STOP_BYTE to be adjacent to the filled portion of the payload */
        memcpy(&(pkt.payload[pkt.payload_len]), &pkt.trailer.crc, 3);

        mm_add_pcap_rec(proto->pcapstream, TX, &pkt, 0, 0);
        if (proto->send_udp) {
            mm_udp_send_pkt(TX, &pkt);
        }

        if (proto->debuglevel > 0) {
            print_mm_packet(TX, &pkt);
        }

        if (proto->debuglevel > 3) {
            printf("\nRaw Packet transmitted: ");
            dump_hex(&pkt.hdr.start, (size_t)pkt.hdr.pktlen + 1);
        }

        write_serial(proto->serial_context, &pkt, (size_t)pkt.hdr.pktlen + 1);
        drain_serial(proto->serial_context);

        /* Don't wait for ACK if sending an ACK. */
        if (payload == NULL) {
            break;
        }

        status = wait_for_mm_ack(proto);
        if (status == PKT_SUCCESS) {
            break;
        }

        printf("%s: Received NACK, retrying %d.\n", __func__, retries);
    }

    if (retries == PKT_MAX_RETRIES) {
        printf("%s: Error: Gave up after %d retries.\n", __func__, retries);
        status |= PKT_ERROR_FAILURE;
    }

    if (payload != NULL) {
        proto->tx_seq++;
    } else {
        proto->rx_seq++;
    }
    return status;
}